

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O3

bool __thiscall QPDFAcroFormDocumentHelper::getNeedAppearances(QPDFAcroFormDocumentHelper *this)

{
  bool bVar1;
  QPDFObjectHandle acroform;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  long local_30 [2];
  QPDFObjectHandle local_20;
  
  QPDF::getRoot((QPDF *)local_50);
  local_40._M_allocated_capacity = (size_type)local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_50 + 0x10),"/AcroForm","");
  QPDFObjectHandle::getKey(&local_20,(string *)local_50);
  if ((long *)local_40._M_allocated_capacity != local_30) {
    operator_delete((void *)local_40._M_allocated_capacity,local_30[0] + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
  }
  bVar1 = QPDFObjectHandle::isDictionary(&local_20);
  if (bVar1) {
    local_40._M_allocated_capacity = (size_type)local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_50 + 0x10),"/NeedAppearances","");
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_50,(string *)&local_20);
    bVar1 = QPDFObjectHandle::isBool((QPDFObjectHandle *)local_50);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
    }
    if ((long *)local_40._M_allocated_capacity != local_30) {
      operator_delete((void *)local_40._M_allocated_capacity,local_30[0] + 1);
    }
    if (bVar1) {
      local_40._M_allocated_capacity = (size_type)local_30;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_50 + 0x10),"/NeedAppearances","");
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_50,(string *)&local_20);
      bVar1 = QPDFObjectHandle::getBoolValue((QPDFObjectHandle *)local_50);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
      }
      if ((long *)local_40._M_allocated_capacity != local_30) {
        operator_delete((void *)local_40._M_allocated_capacity,local_30[0] + 1);
      }
      goto LAB_00151eb2;
    }
  }
  bVar1 = false;
LAB_00151eb2:
  if (local_20.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return bVar1;
}

Assistant:

bool
QPDFAcroFormDocumentHelper::getNeedAppearances()
{
    bool result = false;
    QPDFObjectHandle acroform = qpdf.getRoot().getKey("/AcroForm");
    if (acroform.isDictionary() && acroform.getKey("/NeedAppearances").isBool()) {
        result = acroform.getKey("/NeedAppearances").getBoolValue();
    }
    return result;
}